

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O1

void __thiscall
xray_re::xr_vbuf::load_d3d9(xr_vbuf *this,xr_reader *r,size_t n,d3d_vertex_element *ve,size_t n_ve)

{
  byte bVar1;
  float *pfVar2;
  fcolor *pfVar3;
  short *psVar4;
  undefined1 auVar5 [16];
  fvector3 *pfVar6;
  fvector3 *pfVar7;
  fvector2 *pfVar8;
  uint8_t *puVar9;
  int iVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  fcolor *local_70;
  fvector2 *local_58;
  
  clear(this);
  if (n_ve != 0) {
    sVar12 = 0;
    uVar13 = -(ulong)(n >> 0x3d != 0) | n * 8;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = n;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar5 * ZEXT816(0xc),0);
    }
    local_70 = this->m_colors;
    local_58 = this->m_texcoords;
    pfVar7 = this->m_points;
    pfVar6 = this->m_normals;
    do {
      if (10 < ve[sVar12].usage) {
switchD_00160c4e_caseD_1:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                      ,0xc1,
                      "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                     );
      }
      bVar1 = ve[sVar12].type;
      switch(ve[sVar12].usage) {
      case '\0':
        if (bVar1 != 2) {
          __assert_fail("type == D3D_VE_TYPE_FLOAT3",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xa2,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        if (pfVar7 != (fvector3 *)0x0) {
          __assert_fail("m_points == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xa3,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        pfVar7 = (fvector3 *)operator_new__(uVar11);
        this->m_points = pfVar7;
        break;
      default:
        goto switchD_00160c4e_caseD_1;
      case '\x03':
        if (bVar1 != 4) {
          __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xa8,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        if (pfVar6 != (fvector3 *)0x0) {
          __assert_fail("m_normals == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xa9,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        pfVar6 = (fvector3 *)operator_new__(uVar11);
        this->m_normals = pfVar6;
        break;
      case '\x05':
        if ((1 < bVar1 - 6) && (bVar1 != 1)) {
          __assert_fail("type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xae,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        if (local_58 == (fvector2 *)0x0) {
          local_58 = (fvector2 *)operator_new__(uVar13);
          this->m_texcoords = local_58;
        }
        else {
          pfVar8 = (fvector2 *)operator_new__(uVar13);
          this->m_lightmaps = pfVar8;
        }
        break;
      case '\x06':
      case '\a':
        if (bVar1 != 4) {
          __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xb7,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        break;
      case '\n':
        if (bVar1 != 4) {
          __assert_fail("type == D3D_VE_TYPE_D3DCOLOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xbb,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        if (local_70 != (fcolor *)0x0) {
          __assert_fail("m_colors == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                        ,0xbc,
                        "void xray_re::xr_vbuf::load_d3d9(xr_reader &, size_t, const d3d_vertex_element *, size_t)"
                       );
        }
        local_70 = (fcolor *)operator_new__(-(ulong)(n >> 0x3c != 0) | n << 4);
        this->m_colors = local_70;
      }
      sVar12 = sVar12 + 1;
    } while (n_ve != sVar12);
  }
  (this->super_xr_flexbuf).m_size = n;
  if (n != 0) {
    sVar12 = 0;
    do {
      fVar18 = 0.0;
      fVar17 = 0.0;
      if (n_ve != 0) {
        fVar17 = 0.0;
        sVar14 = 0;
        iVar10 = 0;
        fVar18 = 0.0;
        do {
          switch(ve[sVar14].usage) {
          case '\0':
            pfVar7 = this->m_points;
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            pfVar7[sVar12].field_0.field_0.x = *pfVar2;
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            pfVar7[sVar12].field_0.field_0.y = *pfVar2;
            pfVar2 = (float *)(r->field_2).m_p_u32;
            (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
            pfVar7[sVar12].field_0.field_0.z = *pfVar2;
            break;
          case '\x03':
            pfVar7 = this->m_normals;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar7[sVar12].field_0.field_0.x = fVar16;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar7[sVar12].field_0.field_0.y = fVar16;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar7[sVar12].field_0.field_0.z = fVar16;
            puVar9 = (r->field_2).m_p + 1;
LAB_0016109b:
            (r->field_2).m_p = puVar9;
            if (r->m_end < puVar9) {
LAB_00161163:
              __assert_fail("m_p <= m_end",
                            "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                            ,0x7c,"void xray_re::xr_reader::advance(size_t)");
            }
            break;
          case '\x05':
            if (ve[sVar14].type == '\x06') {
              if (iVar10 == 0) {
                pfVar8 = this->m_texcoords;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                pfVar8[sVar12].field_0.field_0.x = (float)(int)*psVar4 * 0.0009765625;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                pfVar8[sVar12].field_0.field_0.y = (float)(int)*psVar4 * 0.0009765625;
                iVar10 = 1;
              }
              else {
                pfVar8 = this->m_lightmaps;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                pfVar8[sVar12].field_0.field_0.x = (float)(int)*psVar4 * 3.0517578e-05;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                iVar10 = iVar10 + 1;
                pfVar8[sVar12].field_0.field_0.y = (float)(int)*psVar4 * 3.0517578e-05;
              }
            }
            else {
              if (ve[sVar14].type != '\x01') {
                pfVar8 = this->m_texcoords;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                pfVar8[sVar12].field_0.field_0.x = (float)(int)*psVar4 * 0.0009765625;
                psVar4 = (r->field_2).m_p_s16;
                (r->field_2).m_p = (uint8_t *)(psVar4 + 1);
                pfVar8[sVar12].field_0.field_0.y = (float)(int)*psVar4 * 0.0009765625;
                puVar9 = (r->field_2).m_p + 4;
                goto LAB_0016109b;
              }
              bVar15 = iVar10 != 0;
              iVar10 = iVar10 + 1;
              pfVar8 = (&this->m_texcoords)[bVar15];
              pfVar2 = (float *)(r->field_2).m_p_u32;
              (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
              pfVar8[sVar12].field_0.field_0.x = *pfVar2;
              pfVar2 = (float *)(r->field_2).m_p_u32;
              (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
              pfVar8[sVar12].field_0.field_0.y = *pfVar2;
            }
            break;
          case '\x06':
            puVar9 = (r->field_2).m_p;
            (r->field_2).m_p = puVar9 + 3;
            if (r->m_end < puVar9 + 3) goto LAB_00161163;
            fVar17 = xr_reader::r_float_q8(r,0.0,1.0);
            fVar17 = fVar17 * 0.0009765625;
            break;
          case '\a':
            puVar9 = (r->field_2).m_p;
            (r->field_2).m_p = puVar9 + 3;
            if (r->m_end < puVar9 + 3) goto LAB_00161163;
            fVar18 = xr_reader::r_float_q8(r,0.0,1.0);
            fVar18 = fVar18 * 0.0009765625;
            break;
          case '\n':
            pfVar3 = this->m_colors;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar3[sVar12].r = fVar16;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar3[sVar12].g = fVar16;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar3[sVar12].b = fVar16;
            fVar16 = xr_reader::r_float_q8(r,-1.0,1.0);
            pfVar3[sVar12].a = fVar16;
          }
          sVar14 = sVar14 + 1;
        } while (n_ve != sVar14);
      }
      pfVar8 = this->m_texcoords;
      if (pfVar8 != (fvector2 *)0x0) {
        pfVar8[sVar12].field_0.field_0.x = fVar17 + pfVar8[sVar12].field_0.field_0.x;
        this->m_texcoords[sVar12].field_0.field_0.y =
             fVar18 + this->m_texcoords[sVar12].field_0.field_0.y;
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != n);
  }
  make_signature(this);
  return;
}

Assistant:

void xr_vbuf::load_d3d9(xr_reader& r, size_t n, const d3d_vertex_element ve[], size_t n_ve)
{
	clear();

	// validate vertex elements and create buffers
	for (size_t i = 0; i != n_ve; ++i) {
		unsigned type = ve[i].type;
		switch (ve[i].usage) {
		case D3D_VE_USAGE_POSITION:
			xr_assert(type == D3D_VE_TYPE_FLOAT3);
			xr_assert(m_points == 0);
			m_points = new fvector3[n];
			break;

		case D3D_VE_USAGE_NORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_normals == 0);
			m_normals = new fvector3[n];
			break;

		case D3D_VE_USAGE_TEXCOORD:
			xr_assert(type == D3D_VE_TYPE_SHORT2 || type == D3D_VE_TYPE_SHORT4 || type == D3D_VE_TYPE_FLOAT2);
			if (m_texcoords == 0)
				m_texcoords = new fvector2[n];
			else
				m_lightmaps = new fvector2[n];
			break;

		case D3D_VE_USAGE_TANGENT:
		case D3D_VE_USAGE_BINORMAL:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			break;

		case D3D_VE_USAGE_COLOR:
			xr_assert(type == D3D_VE_TYPE_D3DCOLOR);
			xr_assert(m_colors == 0);
			m_colors = new fcolor[n];
			break;

		default:
			xr_not_expected();
			break;
		}
	}

	fvector2 uv_fix;
	set_size(n);
	for (size_t i = 0; i != n; ++i) {
		unsigned tc = 0;
		uv_fix.set(0, 0);
		for (size_t j = 0; j != n_ve; ++j) {
			switch (ve[j].usage) {
			case D3D_VE_USAGE_POSITION:
				r.r_fvector3(m_points[i]);
				break;
			case D3D_VE_USAGE_NORMAL:
				r_qnormal(r, m_normals[i]);
				break;
			case D3D_VE_USAGE_TEXCOORD:
				switch (ve[j].type) {
				case D3D_VE_TYPE_FLOAT2:
					r.r_fvector2(++tc == 1 ? m_texcoords[i] : m_lightmaps[i]);
					break;
				case D3D_VE_TYPE_SHORT2:
					if (++tc == 1)
						r_qtexcoord(r, m_texcoords[i]);
					else
						r_qlightmap(r, m_lightmaps[i]);
					break;
				default:
				case D3D_VE_TYPE_SHORT4:
					r_qtexcoord(r, m_texcoords[i]);
					r.advance(2*sizeof(int16_t));
					break;
				}
				break;
			case D3D_VE_USAGE_TANGENT:
				r.advance(3*sizeof(uint8_t));
				uv_fix.x = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_BINORMAL:
				r.advance(3*sizeof(uint8_t));
				uv_fix.y = r.r_float_q8()*(32.f/32768.f);
				break;
			case D3D_VE_USAGE_COLOR:
				r_qcolor(r, m_colors[i]);
				break;
			}
		}
		if (m_texcoords) {
			m_texcoords[i].x += uv_fix.x;
			m_texcoords[i].y += uv_fix.y;
		}
	}
	make_signature();
}